

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucase.cpp
# Opt level: O0

UBool ucase_isCaseSensitive_63(UChar32 c)

{
  ushort uVar1;
  uint uVar2;
  int iVar3;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  uint16_t *pe;
  uint16_t props;
  UChar32 c_local;
  
  uVar2 = c >> 5;
  if ((uint)c < 0xd800) {
    local_2c = (uint)ucase_props_trieIndex[(int)uVar2] * 4 + (c & 0x1fU);
  }
  else {
    if ((uint)c < 0x10000) {
      iVar3 = 0;
      if (c < 0xdc00) {
        iVar3 = 0x140;
      }
      local_30 = (uint)ucase_props_trieIndex[(int)(iVar3 + uVar2)] * 4 + (c & 0x1fU);
    }
    else {
      if ((uint)c < 0x110000) {
        if (c < 0xe0800) {
          local_38 = (uint)ucase_props_trieIndex
                           [(int)((uint)ucase_props_trieIndex[(c >> 0xb) + 0x820] + (uVar2 & 0x3f))]
                     * 4 + (c & 0x1fU);
        }
        else {
          local_38 = 0x2f1c;
        }
        local_34 = local_38;
      }
      else {
        local_34 = 0xd30;
      }
      local_30 = local_34;
    }
    local_2c = local_30;
  }
  uVar1 = ucase_props_trieIndex[local_2c];
  if ((uVar1 & 8) == 0) {
    uVar1 = uVar1 & 0x10;
  }
  else {
    uVar1 = ucase_props_exceptions[(int)(uint)uVar1 >> 4] & 0x800;
  }
  props._1_1_ = uVar1 != 0;
  return props._1_1_;
}

Assistant:

U_CAPI UBool U_EXPORT2
ucase_isCaseSensitive(UChar32 c) {
    uint16_t props=UTRIE2_GET16(&ucase_props_singleton.trie, c);
    if(!UCASE_HAS_EXCEPTION(props)) {
        return (UBool)((props&UCASE_SENSITIVE)!=0);
    } else {
        const uint16_t *pe=GET_EXCEPTIONS(&ucase_props_singleton, props);
        return (UBool)((*pe&UCASE_EXC_SENSITIVE)!=0);
    }
}